

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O3

void __thiscall Assimp::ColladaExporter::WriteLightsLibrary(ColladaExporter *this)

{
  ostream *poVar1;
  size_t pIndex;
  
  if ((this->mScene->mLights != (aiLight **)0x0) && (this->mScene->mNumLights != 0)) {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&this->field_0x38,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"<library_lights>",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    std::__cxx11::string::append((char *)&this->startstr);
    if (this->mScene->mNumLights != 0) {
      pIndex = 0;
      do {
        WriteLight(this,pIndex);
        pIndex = pIndex + 1;
      } while (pIndex < this->mScene->mNumLights);
    }
    PopTag(this);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&this->field_0x38,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</library_lights>",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    return;
  }
  return;
}

Assistant:

void ColladaExporter::WriteLightsLibrary() {
    if(mScene->HasLights()) {

        mOutput << startstr << "<library_lights>" << endstr;
        PushTag();

        for( size_t a = 0; a < mScene->mNumLights; ++a)
            WriteLight( a);

        PopTag();
        mOutput << startstr << "</library_lights>" << endstr;

    }
}